

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

bool __thiscall OpenMesh::IO::_PLYReader_::can_u_read(_PLYReader_ *this,istream *_is)

{
  bool bVar1;
  byte bVar2;
  ValueType VVar3;
  mostream *pmVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  undefined1 auVar7 [16];
  fpos<__mbstate_t> local_540;
  undefined1 local_530 [16];
  uint local_51c;
  undefined1 local_518 [8];
  VertexPropertyInfo entry_15;
  VertexProperty prop;
  VertexPropertyInfo entry_14;
  undefined1 local_4b8 [8];
  VertexPropertyInfo entry_13;
  undefined1 local_488 [8];
  VertexPropertyInfo entry_12;
  undefined1 local_458 [8];
  VertexPropertyInfo entry_11;
  undefined1 local_428 [8];
  VertexPropertyInfo entry_10;
  undefined1 local_3f8 [8];
  VertexPropertyInfo entry_9;
  undefined1 local_3c8 [8];
  VertexPropertyInfo entry_8;
  undefined1 local_398 [8];
  VertexPropertyInfo entry_7;
  undefined1 local_368 [8];
  VertexPropertyInfo entry_6;
  undefined1 local_338 [8];
  VertexPropertyInfo entry_5;
  undefined1 local_308 [8];
  VertexPropertyInfo entry_4;
  undefined1 local_2d8 [8];
  VertexPropertyInfo entry_3;
  undefined1 local_2a8 [8];
  VertexPropertyInfo entry_2;
  undefined1 local_278 [8];
  VertexPropertyInfo entry_1;
  undefined1 local_248 [8];
  VertexPropertyInfo entry;
  string local_200 [32];
  IO local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [36];
  ValueType local_17c;
  string local_178 [4];
  ValueType valueType;
  string tmp2;
  string local_158 [8];
  string tmp1;
  undefined1 local_138 [16];
  streamoff local_128;
  streamoff streamPos;
  string local_118 [4];
  float version;
  string listEntryType;
  string local_f8 [8];
  string listIndexType;
  string local_d8 [8];
  string propertyName;
  allocator local_b1;
  string local_b0 [8];
  string elementName;
  string local_90 [8];
  string fileType;
  string local_70 [8];
  string keyword;
  string local_40 [8];
  string line;
  istream *_is_local;
  _PLYReader_ *this_local;
  
  Options::cleanup(&this->options_,(EVP_PKEY_CTX *)_is);
  std::
  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::clear(&this->vertexPropertyMap_);
  this->vertexPropertyCount_ = 0;
  std::__cxx11::string::string(local_40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_is,local_40);
  trim((string *)local_40);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"PLY");
  if (bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"ply");
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00313abc;
    }
  }
  this->vertexCount_ = 0;
  this->faceCount_ = 0;
  this->vertexDimension_ = 0;
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8);
  std::__cxx11::string::string(local_118);
  std::operator>>(_is,local_70);
  std::operator>>(_is,local_90);
  std::istream::operator>>(_is,(float *)((long)&streamPos + 4));
  bVar2 = std::ios::bad();
  if ((bVar2 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"ascii");
    if (bVar1) {
      Options::operator-=(&this->options_,1);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"binary_little_endian");
      if (bVar1) {
        Options::operator+=(&this->options_,1);
        Options::operator+=(&this->options_,4);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"binary_big_endian");
        if (!bVar1) {
          pmVar4 = omerr();
          poVar5 = std::operator<<(&pmVar4->super_ostream,"Unsupported PLY format: ");
          poVar5 = std::operator<<(poVar5,local_90);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          goto LAB_00313a2e;
        }
        Options::operator+=(&this->options_,1);
        Options::operator+=(&this->options_,2);
      }
    }
    local_138 = std::istream::tellg();
    local_128 = std::fpos::operator_cast_to_long((fpos *)local_138);
    std::operator>>(_is,local_70);
    do {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"end_header");
      if (!bVar1) {
        bVar1 = Options::is_binary(&this->options_);
        if (bVar1) {
          std::fpos<__mbstate_t>::fpos(&local_540,local_128 + 0xc);
          std::istream::seekg(_is,local_540._M_off,local_540._M_state);
        }
        this_local._7_1_ = 1;
        goto LAB_00313a2e;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"comment");
      if (bVar1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(_is,local_40);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_70,"element");
        if (bVar1) {
          std::operator>>(_is,local_b0);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,"vertex");
          if (bVar1) {
            std::istream::operator>>(_is,&this->vertexCount_);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,"face");
            if (bVar1) {
              std::istream::operator>>(_is,&this->faceCount_);
            }
            else {
              pmVar4 = omerr();
              poVar5 = std::operator<<(&pmVar4->super_ostream,
                                       "PLY header unsupported element type: ");
              poVar5 = std::operator<<(poVar5,local_b0);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_70,"property");
          if (bVar1) {
            std::__cxx11::string::string(local_158);
            std::__cxx11::string::string(local_178);
            std::operator>>(_is,local_158);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_158,"list");
            if (bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0,"vertex");
              if (bVar1) {
                pmVar4 = omerr();
                poVar5 = std::operator<<(&pmVar4->super_ostream,
                                         "List type not supported for vertices!");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                goto LAB_00313835;
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0,"face");
              if (!bVar1) goto LAB_00313835;
              std::operator>>(_is,local_f8);
              std::operator>>(_is,local_118);
              std::operator>>(_is,local_d8);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f8,"uint8");
              if (bVar1) {
                this->faceIndexType_ = ValueTypeUINT8;
LAB_00312677:
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_118,"int32");
                if (bVar1) {
                  this->faceEntryType_ = ValueTypeINT32;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_118,"int");
                  if (bVar1) {
                    this->faceEntryType_ = ValueTypeINT;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_118,"uint32");
                    if (bVar1) {
                      this->faceEntryType_ = ValueTypeUINT32;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_118,"uint");
                      if (!bVar1) {
                        pmVar4 = omerr();
                        poVar5 = std::operator<<(&pmVar4->super_ostream,
                                                 "Unsupported Entry type for face list: ");
                        poVar5 = std::operator<<(poVar5,local_118);
                        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                        this_local._7_1_ = 0;
                        bVar1 = true;
                        goto LAB_0031383c;
                      }
                      this->faceEntryType_ = ValueTypeUINT;
                    }
                  }
                }
                goto LAB_00313835;
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f8,"uchar");
              if (bVar1) {
                this->faceIndexType_ = ValueTypeUCHAR;
                goto LAB_00312677;
              }
              pmVar4 = omerr();
              poVar5 = std::operator<<(&pmVar4->super_ostream,
                                       "Unsupported Index type for face list: ");
              poVar5 = std::operator<<(poVar5,local_f8);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = 0;
              bVar1 = true;
            }
            else {
              std::operator>>(_is,local_178);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0,"vertex");
              if (bVar1) {
                std::__cxx11::string::string(local_1a0,local_158);
                std::__cxx11::string::string(local_1c0,local_178);
                VVar3 = get_property_type((string *)local_1a0,(string *)local_1c0);
                std::__cxx11::string::~string(local_1c0);
                std::__cxx11::string::~string(local_1a0);
                local_17c = VVar3;
                std::__cxx11::string::string(local_200,local_158);
                std::__cxx11::string::string((string *)&entry.field_0x20,local_178);
                get_property_name(local_1e0,(string *)local_200,(string *)&entry.field_0x20);
                std::__cxx11::string::operator=(local_d8,(string *)local_1e0);
                std::__cxx11::string::~string((string *)local_1e0);
                std::__cxx11::string::~string((string *)&entry.field_0x20);
                std::__cxx11::string::~string(local_200);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d8,"x");
                if (bVar1) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)local_248,XCOORD,local_17c);
                  entry_1._36_4_ = this->vertexPropertyCount_;
                  pmVar6 = std::
                           map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                           ::operator[](&this->vertexPropertyMap_,(key_type *)&entry_1.field_0x24);
                  VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_248);
                  this->vertexDimension_ = this->vertexDimension_ + 1;
                  VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_248);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d8,"y");
                  if (bVar1) {
                    VertexPropertyInfo::VertexPropertyInfo
                              ((VertexPropertyInfo *)local_278,YCOORD,local_17c);
                    entry_2._36_4_ = this->vertexPropertyCount_;
                    pmVar6 = std::
                             map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                             ::operator[](&this->vertexPropertyMap_,(key_type *)&entry_2.field_0x24)
                    ;
                    VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_278);
                    this->vertexDimension_ = this->vertexDimension_ + 1;
                    VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_278);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_d8,"z");
                    if (bVar1) {
                      VertexPropertyInfo::VertexPropertyInfo
                                ((VertexPropertyInfo *)local_2a8,ZCOORD,local_17c);
                      entry_3._36_4_ = this->vertexPropertyCount_;
                      pmVar6 = std::
                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                               ::operator[](&this->vertexPropertyMap_,
                                            (key_type *)&entry_3.field_0x24);
                      VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_2a8);
                      this->vertexDimension_ = this->vertexDimension_ + 1;
                      VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_2a8);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_d8,"nx");
                      if (bVar1) {
                        VertexPropertyInfo::VertexPropertyInfo
                                  ((VertexPropertyInfo *)local_2d8,XNORM,local_17c);
                        entry_4._36_4_ = this->vertexPropertyCount_;
                        pmVar6 = std::
                                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                 ::operator[](&this->vertexPropertyMap_,
                                              (key_type *)&entry_4.field_0x24);
                        VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_2d8);
                        Options::operator+=(&this->options_,0x10);
                        VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_2d8);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_d8,"ny");
                        if (bVar1) {
                          VertexPropertyInfo::VertexPropertyInfo
                                    ((VertexPropertyInfo *)local_308,YNORM,local_17c);
                          entry_5._36_4_ = this->vertexPropertyCount_;
                          pmVar6 = std::
                                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                   ::operator[](&this->vertexPropertyMap_,
                                                (key_type *)&entry_5.field_0x24);
                          VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_308);
                          Options::operator+=(&this->options_,0x10);
                          VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_308);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"nz");
                          if (bVar1) {
                            VertexPropertyInfo::VertexPropertyInfo
                                      ((VertexPropertyInfo *)local_338,ZNORM,local_17c);
                            entry_6._36_4_ = this->vertexPropertyCount_;
                            pmVar6 = std::
                                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                     ::operator[](&this->vertexPropertyMap_,
                                                  (key_type *)&entry_6.field_0x24);
                            VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_338);
                            Options::operator+=(&this->options_,0x10);
                            VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_338)
                            ;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"u");
                            if (!bVar1) {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"s");
                              if (!bVar1) {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"v");
                                if (!bVar1) {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"t");
                                  if (!bVar1) {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"red");
                                    if (bVar1) {
                                      VertexPropertyInfo::VertexPropertyInfo
                                                ((VertexPropertyInfo *)local_3c8,COLORRED,local_17c)
                                      ;
                                      entry_9._36_4_ = this->vertexPropertyCount_;
                                      pmVar6 = std::
                                               map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                               ::operator[](&this->vertexPropertyMap_,
                                                            (key_type *)&entry_9.field_0x24);
                                      VertexPropertyInfo::operator=
                                                (pmVar6,(VertexPropertyInfo *)local_3c8);
                                      Options::operator+=(&this->options_,0x20);
                                      if ((local_17c == ValueTypeFLOAT) ||
                                         (local_17c == ValueTypeFLOAT32)) {
                                        Options::operator+=(&this->options_,0x1000);
                                      }
                                      VertexPropertyInfo::~VertexPropertyInfo
                                                ((VertexPropertyInfo *)local_3c8);
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"green");
                                      if (bVar1) {
                                        VertexPropertyInfo::VertexPropertyInfo
                                                  ((VertexPropertyInfo *)local_3f8,COLORGREEN,
                                                   local_17c);
                                        entry_10._36_4_ = this->vertexPropertyCount_;
                                        pmVar6 = std::
                                                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                 ::operator[](&this->vertexPropertyMap_,
                                                              (key_type *)&entry_10.field_0x24);
                                        VertexPropertyInfo::operator=
                                                  (pmVar6,(VertexPropertyInfo *)local_3f8);
                                        Options::operator+=(&this->options_,0x20);
                                        if ((local_17c == ValueTypeFLOAT) ||
                                           (local_17c == ValueTypeFLOAT32)) {
                                          Options::operator+=(&this->options_,0x1000);
                                        }
                                        VertexPropertyInfo::~VertexPropertyInfo
                                                  ((VertexPropertyInfo *)local_3f8);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"blue");
                                        if (bVar1) {
                                          VertexPropertyInfo::VertexPropertyInfo
                                                    ((VertexPropertyInfo *)local_428,COLORBLUE,
                                                     local_17c);
                                          entry_11._36_4_ = this->vertexPropertyCount_;
                                          pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&entry_11.field_0x24);
                                          VertexPropertyInfo::operator=
                                                    (pmVar6,(VertexPropertyInfo *)local_428);
                                          Options::operator+=(&this->options_,0x20);
                                          if ((local_17c == ValueTypeFLOAT) ||
                                             (local_17c == ValueTypeFLOAT32)) {
                                            Options::operator+=(&this->options_,0x1000);
                                          }
                                          VertexPropertyInfo::~VertexPropertyInfo
                                                    ((VertexPropertyInfo *)local_428);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"diffuse_red");
                                          if (bVar1) {
                                            VertexPropertyInfo::VertexPropertyInfo
                                                      ((VertexPropertyInfo *)local_458,COLORRED,
                                                       local_17c);
                                            entry_12._36_4_ = this->vertexPropertyCount_;
                                            pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&entry_12.field_0x24);
                                            VertexPropertyInfo::operator=
                                                      (pmVar6,(VertexPropertyInfo *)local_458);
                                            Options::operator+=(&this->options_,0x20);
                                            if ((local_17c == ValueTypeFLOAT) ||
                                               (local_17c == ValueTypeFLOAT32)) {
                                              Options::operator+=(&this->options_,0x1000);
                                            }
                                            VertexPropertyInfo::~VertexPropertyInfo
                                                      ((VertexPropertyInfo *)local_458);
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"diffuse_green");
                                            if (bVar1) {
                                              VertexPropertyInfo::VertexPropertyInfo
                                                        ((VertexPropertyInfo *)local_488,COLORGREEN,
                                                         local_17c);
                                              entry_13._36_4_ = this->vertexPropertyCount_;
                                              pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&entry_13.field_0x24);
                                              VertexPropertyInfo::operator=
                                                        (pmVar6,(VertexPropertyInfo *)local_488);
                                              Options::operator+=(&this->options_,0x20);
                                              if ((local_17c == ValueTypeFLOAT) ||
                                                 (local_17c == ValueTypeFLOAT32)) {
                                                Options::operator+=(&this->options_,0x1000);
                                              }
                                              VertexPropertyInfo::~VertexPropertyInfo
                                                        ((VertexPropertyInfo *)local_488);
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"diffuse_blue");
                                              if (bVar1) {
                                                VertexPropertyInfo::VertexPropertyInfo
                                                          ((VertexPropertyInfo *)local_4b8,COLORBLUE
                                                           ,local_17c);
                                                entry_14._36_4_ = this->vertexPropertyCount_;
                                                pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&entry_14.field_0x24);
                                                VertexPropertyInfo::operator=
                                                          (pmVar6,(VertexPropertyInfo *)local_4b8);
                                                Options::operator+=(&this->options_,0x20);
                                                if ((local_17c == ValueTypeFLOAT) ||
                                                   (local_17c == ValueTypeFLOAT32)) {
                                                  Options::operator+=(&this->options_,0x1000);
                                                }
                                                VertexPropertyInfo::~VertexPropertyInfo
                                                          ((VertexPropertyInfo *)local_4b8);
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d8,"alpha");
                                                if (bVar1) {
                                                  VertexPropertyInfo::VertexPropertyInfo
                                                            ((VertexPropertyInfo *)&prop,COLORALPHA,
                                                             local_17c);
                                                  entry_15._36_4_ = this->vertexPropertyCount_;
                                                  pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&entry_15.field_0x24);
                                                  VertexPropertyInfo::operator=
                                                            (pmVar6,(VertexPropertyInfo *)&prop);
                                                  Options::operator+=(&this->options_,0x20);
                                                  Options::operator+=(&this->options_,0x800);
                                                  if ((local_17c == ValueTypeFLOAT) ||
                                                     (local_17c == ValueTypeFLOAT32)) {
                                                    Options::operator+=(&this->options_,0x1000);
                                                  }
                                                  VertexPropertyInfo::~VertexPropertyInfo
                                                            ((VertexPropertyInfo *)&prop);
                                                }
                                                else {
                                                  bVar1 = Options::is_binary(&this->options_);
                                                  entry_15._32_4_ = 0xd;
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    entry_15._32_4_ = 0xc;
                                                  }
                                                  if (entry_15._32_4_ != 0xd) {
                                                    Options::operator+=(&this->options_,0x2000);
                                                  }
                                                  VertexPropertyInfo::VertexPropertyInfo
                                                            ((VertexPropertyInfo *)local_518,
                                                             entry_15._32_4_,local_17c,
                                                             (string *)local_d8);
                                                  local_51c = this->vertexPropertyCount_;
                                                  pmVar6 = std::
                                                  map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                                  ::operator[](&this->vertexPropertyMap_,
                                                               (key_type *)&local_51c);
                                                  VertexPropertyInfo::operator=
                                                            (pmVar6,(VertexPropertyInfo *)local_518)
                                                  ;
                                                  VertexPropertyInfo::~VertexPropertyInfo
                                                            ((VertexPropertyInfo *)local_518);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    goto LAB_003137b7;
                                  }
                                }
                                VertexPropertyInfo::VertexPropertyInfo
                                          ((VertexPropertyInfo *)local_398,TEXY,local_17c);
                                entry_8._36_4_ = this->vertexPropertyCount_;
                                pmVar6 = std::
                                         map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                         ::operator[](&this->vertexPropertyMap_,
                                                      (key_type *)&entry_8.field_0x24);
                                VertexPropertyInfo::operator=
                                          (pmVar6,(VertexPropertyInfo *)local_398);
                                Options::operator+=(&this->options_,0x40);
                                VertexPropertyInfo::~VertexPropertyInfo
                                          ((VertexPropertyInfo *)local_398);
                                goto LAB_003137b7;
                              }
                            }
                            VertexPropertyInfo::VertexPropertyInfo
                                      ((VertexPropertyInfo *)local_368,TEXX,local_17c);
                            entry_7._36_4_ = this->vertexPropertyCount_;
                            pmVar6 = std::
                                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                     ::operator[](&this->vertexPropertyMap_,
                                                  (key_type *)&entry_7.field_0x24);
                            VertexPropertyInfo::operator=(pmVar6,(VertexPropertyInfo *)local_368);
                            Options::operator+=(&this->options_,0x40);
                            VertexPropertyInfo::~VertexPropertyInfo((VertexPropertyInfo *)local_368)
                            ;
                          }
                        }
                      }
                    }
                  }
                }
LAB_003137b7:
                this->vertexPropertyCount_ = this->vertexPropertyCount_ + 1;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0,"face");
                if (bVar1) {
                  pmVar4 = omerr();
                  poVar5 = std::operator<<(&pmVar4->super_ostream,
                                           "Properties not supported for faces ");
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                }
              }
LAB_00313835:
              bVar1 = false;
            }
LAB_0031383c:
            std::__cxx11::string::~string(local_178);
            std::__cxx11::string::~string(local_158);
            if (bVar1) goto LAB_00313a2e;
          }
          else {
            pmVar4 = omlog();
            poVar5 = std::operator<<(&pmVar4->super_ostream,"Unsupported keyword : ");
            poVar5 = std::operator<<(poVar5,local_70);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      auVar7 = std::istream::tellg();
      local_530 = auVar7;
      local_128 = std::fpos::operator_cast_to_long((fpos *)local_530);
      std::operator>>(_is,local_70);
      bVar2 = std::ios::bad();
    } while ((bVar2 & 1) == 0);
    pmVar4 = omerr();
    poVar5 = std::operator<<(&pmVar4->super_ostream,"Error while reading PLY file header");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    pmVar4 = omerr();
    poVar5 = std::operator<<(&pmVar4->super_ostream,"Defect PLY header detected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
LAB_00313a2e:
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
LAB_00313abc:
  std::__cxx11::string::~string(local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool _PLYReader_::can_u_read(std::istream& _is) const {

    // Clear per file options
    options_.cleanup();

    // clear vertex property map, will be recreated
    vertexPropertyMap_.clear();
    vertexPropertyCount_ = 0;

    // read 1st line
    std::string line;
    std::getline(_is, line);
    trim(line);

    //Check if this file is really a ply format
    if (line != "PLY" && line != "ply")
        return false;

    vertexCount_ = 0;
    faceCount_ = 0;
    vertexDimension_ = 0;

    std::string keyword;
    std::string fileType;
    std::string elementName = "";
    std::string propertyName;
    std::string listIndexType;
    std::string listEntryType;
    float version;

    _is >> keyword;
    _is >> fileType;
    _is >> version;

    if (_is.bad()) {
        omerr() << "Defect PLY header detected" << std::endl;
        return false;
    }

    if (fileType == "ascii") {
        options_ -= Options::Binary;
    } else if (fileType == "binary_little_endian") {
        options_ += Options::Binary;
        options_ += Options::LSB;
        //if (Endian::local() == Endian::MSB)

        //  options_ += Options::Swap;
    } else if (fileType == "binary_big_endian") {
        options_ += Options::Binary;
        options_ += Options::MSB;
        //if (Endian::local() == Endian::LSB)

        //  options_ += Options::Swap;
    } else {
        omerr() << "Unsupported PLY format: " << fileType << std::endl;
        return false;
    }

    std::streamoff streamPos = _is.tellg();
    _is >> keyword;
    while (keyword != "end_header") {

        if (keyword == "comment") {
            std::getline(_is, line);
        } else if (keyword == "element") {
            _is >> elementName;
            if (elementName == "vertex") {
                _is >> vertexCount_;
            } else if (elementName == "face") {
                _is >> faceCount_;
            } else {
                omerr() << "PLY header unsupported element type: " << elementName << std::endl;
            }
        } else if (keyword == "property") {
            std::string tmp1;
            std::string tmp2;

            // Read first keyword, as it might be a list
            _is >> tmp1;

            if (tmp1 == "list") {
                if (elementName == "vertex") {
                    omerr() << "List type not supported for vertices!" << std::endl;
                } else if (elementName == "face") {
                    _is >> listIndexType;
                    _is >> listEntryType;
                    _is >> propertyName;

                    if (listIndexType == "uint8") {
                        faceIndexType_ = ValueTypeUINT8;
                    } else if (listIndexType == "uchar") {
                        faceIndexType_ = ValueTypeUCHAR;
                    } else {
                        omerr() << "Unsupported Index type for face list: " << listIndexType << std::endl;
                        return false;
                    }

                    if (listEntryType == "int32") {
                        faceEntryType_ = ValueTypeINT32;
                    } else if (listEntryType == "int") {
                        faceEntryType_ = ValueTypeINT;
                    } else if (listEntryType == "uint32") {
                        faceEntryType_ = ValueTypeUINT32;
                    } else if (listEntryType == "uint") {
                        faceEntryType_ = ValueTypeUINT;
                    } else {
                        omerr() << "Unsupported Entry type for face list: " << listEntryType << std::endl;
                        return false;
                    }

                }
            } else {
                // as this is not a list property, read second value of property
                _is >> tmp2;

                if (elementName == "vertex") {
                    // Extract name and type of property
                    // As the order seems to be different in some files, autodetect it.
                    ValueType valueType = get_property_type(tmp1, tmp2);
                    propertyName = get_property_name(tmp1, tmp2);

                    if (propertyName == "x") {
                      VertexPropertyInfo entry(XCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "y") {
                      VertexPropertyInfo entry(YCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "z") {
                      VertexPropertyInfo entry(ZCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "nx") {
                      VertexPropertyInfo entry(XNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "ny") {
                      VertexPropertyInfo entry(YNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "nz") {
                      VertexPropertyInfo entry(ZNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "u" || propertyName == "s") {
                      VertexPropertyInfo entry(TEXX, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "v" || propertyName == "t") {
                      VertexPropertyInfo entry(TEXY, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "alpha") {
                      VertexPropertyInfo entry(COLORALPHA, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      options_ += Options::ColorAlpha;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else {
                      VertexProperty prop = (!options_.is_binary()) ? CUSTOM_PROP : UNSUPPORTED; // loading vertex properties is not yet supported by the binary loader
                      if (prop != UNSUPPORTED)
                        options_ += Options::Custom;
                      VertexPropertyInfo entry(prop, valueType, propertyName);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                    }

                    vertexPropertyCount_++;

                } else if (elementName == "face") {
                    omerr() << "Properties not supported for faces " << std::endl;
                }

            }

        } else {
            omlog() << "Unsupported keyword : " << keyword << std::endl;
        }

        streamPos = _is.tellg();
        _is >> keyword;
        if (_is.bad()) {
            omerr() << "Error while reading PLY file header" << std::endl;
            return false;
        }
    }

    // As the binary data is directy after the end_header keyword
    // and the stream removes too many bytes, seek back to the right position
    if (options_.is_binary()) {
        _is.seekg(streamPos + 12);
    }

    return true;
}